

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# np_nes_dmc.c
# Opt level: O1

void NES_DMC_np_SetClock(void *chip,UINT32 c)

{
  uint uVar1;
  undefined4 uVar2;
  uint uVar3;
  
  *(UINT32 *)((long)chip + 0x4009c) = c;
  uVar3 = c - 0x195e8f;
  uVar1 = -uVar3;
  if (0 < (int)uVar3) {
    uVar1 = uVar3;
  }
  uVar2 = 0x1d22;
  if (uVar1 < 0x3e9) {
    uVar2 = 0x207a;
  }
  *(uint *)((long)chip + 0x400a4) = (uint)(uVar1 < 0x3e9);
  *(undefined4 *)((long)chip + 0x4010c) = uVar2;
  return;
}

Assistant:

void NES_DMC_np_SetClock(void* chip, UINT32 c)
{
	NES_DMC* dmc = (NES_DMC*)chip;

	dmc->clock = c;
	
	if (abs((int)dmc->clock - DEFAULT_CLK_PAL) <= 1000)	// check for approximately DEFAULT_CLK_PAL
		NES_DMC_np_SetPal(dmc, true);
	else
		NES_DMC_np_SetPal(dmc, false);
}